

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Label __thiscall
asmjit::v1_14::BaseBuilder::newNamedLabel
          (BaseBuilder *this,char *name,size_t nameSize,LabelType type,uint32_t parentId)

{
  Error EVar1;
  undefined7 in_register_00000009;
  uint32_t extraout_RDX [2];
  uint32_t extraout_RDX_00 [2];
  undefined4 uVar2;
  uint32_t in_R9D;
  Label LVar3;
  LabelEntry *le;
  LabelEntry *local_20;
  
  uVar2 = 0xffffffff;
  if (*(CodeHolder **)(name + 0x30) != (CodeHolder *)0x0) {
    EVar1 = CodeHolder::newNamedLabelEntry
                      (*(CodeHolder **)(name + 0x30),&local_20,(char *)nameSize,
                       CONCAT71(in_register_00000009,type),(LabelType)parentId,in_R9D);
    nameSize = (size_t)extraout_RDX;
    if (EVar1 == 0) {
      EVar1 = BaseBuilder_newLabelInternal((BaseBuilder *)name,*(uint32_t *)&local_20->field_0xc);
      nameSize = (size_t)extraout_RDX_00;
      if (EVar1 == 0) {
        uVar2 = *(undefined4 *)&local_20->field_0xc;
      }
    }
  }
  *(undefined4 *)&(this->super_BaseEmitter)._vptr_BaseEmitter = 5;
  *(undefined4 *)((long)&(this->super_BaseEmitter)._vptr_BaseEmitter + 4) = uVar2;
  (this->super_BaseEmitter)._emitterType = kNone;
  (this->super_BaseEmitter)._emitterFlags = kNone;
  (this->super_BaseEmitter)._instructionAlignment = '\0';
  (this->super_BaseEmitter)._reservedBaseEmitter = '\0';
  (this->super_BaseEmitter)._validationFlags = kNone;
  LVar3.super_Operand.super_Operand_._data[0] = (uint32_t)nameSize;
  LVar3.super_Operand.super_Operand_._data[1] = SUB84(nameSize,4);
  LVar3.super_Operand.super_Operand_._0_8_ = this;
  return (Label)LVar3.super_Operand.super_Operand_;
}

Assistant:

Label BaseBuilder::newNamedLabel(const char* name, size_t nameSize, LabelType type, uint32_t parentId) {
  uint32_t labelId = Globals::kInvalidId;
  LabelEntry* le;

  if (_code &&
      _code->newNamedLabelEntry(&le, name, nameSize, type, parentId) == kErrorOk &&
      BaseBuilder_newLabelInternal(this, le->id()) == kErrorOk) {
    labelId = le->id();
  }

  return Label(labelId);
}